

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

uint64_t roaring64_iterator_read(roaring64_iterator_t *it,uint64_t *buf,uint64_t count)

{
  ushort *puVar1;
  long lVar2;
  _Bool _Var3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  uint16_t low16;
  uint32_t container_consumed;
  art_iterator_t *local_38;
  
  uVar6 = 0;
  if ((count != 0) && ((it->has_value & 1U) != 0)) {
    local_38 = &it->art_it;
    uVar6 = 0;
    do {
      uVar10 = *(it->art_it).value;
      low16 = (uint16_t)it->value;
      uVar9 = count - uVar6;
      if (0xfffffffe < uVar9) {
        uVar9 = 0xffffffff;
      }
      _Var3 = container_iterator_read_into_uint64
                        (it->r->containers[uVar10 >> 8],(uint8_t)uVar10,&it->container_it,it->high48
                         ,buf,(uint32_t)uVar9,&container_consumed,&low16);
      uVar10 = (ulong)container_consumed;
      uVar6 = uVar6 + uVar10;
      if (_Var3) {
        it->has_value = true;
        it->value = (ulong)low16 | it->high48;
        return uVar6;
      }
      _Var3 = art_iterator_move(local_38,true);
      it->has_value = _Var3;
      if (_Var3) {
        uVar9 = (ulong)*(ushort *)((it->art_it).key + 4) << 0x20;
        uVar4 = (ulong)*(uint6 *)(it->art_it).key;
        uVar4 = (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 | (uVar4 & 0xff00) << 0x28 |
                uVar4 << 0x38;
        it->high48 = uVar4;
        uVar9 = *(it->art_it).value;
        puVar1 = *(ushort **)((long)it->r->containers[uVar9 >> 8] + 8);
        if (((char)uVar9 == '\x03') || (((uint)uVar9 & 0xff) == 2)) {
          uVar5 = (uint)*puVar1;
          uVar8 = 0;
        }
        else {
          uVar8 = 0;
          iVar7 = -0x40;
          do {
            uVar9 = *(ulong *)(puVar1 + (ulong)uVar8 * 4);
            uVar8 = uVar8 + 1;
            iVar7 = iVar7 + 0x40;
          } while (uVar9 == 0);
          lVar2 = 0;
          if (uVar9 != 0) {
            for (; (uVar9 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
            }
          }
          uVar5 = (int)lVar2 + iVar7;
          uVar8 = uVar5;
        }
        (it->container_it).index = uVar8;
        it->value = uVar4 | uVar5 & 0xffff;
        it->has_value = true;
      }
      buf = buf + uVar10;
    } while (_Var3 && uVar6 < count);
  }
  return uVar6;
}

Assistant:

uint64_t roaring64_iterator_read(roaring64_iterator_t *it, uint64_t *buf,
                                 uint64_t count) {
    uint64_t consumed = 0;
    while (it->has_value && consumed < count) {
        uint32_t container_consumed;
        leaf_t leaf = (leaf_t)*it->art_it.value;
        uint16_t low16 = (uint16_t)it->value;
        uint32_t container_count = UINT32_MAX;
        if (count - consumed < (uint64_t)UINT32_MAX) {
            container_count = count - consumed;
        }
        bool has_value = container_iterator_read_into_uint64(
            get_container(it->r, leaf), get_typecode(leaf), &it->container_it,
            it->high48, buf, container_count, &container_consumed, &low16);
        consumed += container_consumed;
        buf += container_consumed;
        if (has_value) {
            it->has_value = true;
            it->value = it->high48 | low16;
            assert(consumed == count);
            return consumed;
        }
        it->has_value = art_iterator_next(&it->art_it);
        if (it->has_value) {
            roaring64_iterator_init_at_leaf_first(it);
        }
    }
    return consumed;
}